

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

void __thiscall
flow::CastInstr::CastInstr(CastInstr *this,LiteralType resultType,Value *op,string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_59;
  Value *local_58;
  iterator local_50;
  size_type local_48;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  string *local_28;
  string *name_local;
  Value *op_local;
  CastInstr *pCStack_10;
  LiteralType resultType_local;
  CastInstr *this_local;
  
  local_50 = &local_58;
  local_48 = 1;
  local_58 = op;
  local_28 = name;
  name_local = (string *)op;
  op_local._4_4_ = resultType;
  pCStack_10 = this;
  std::allocator<flow::Value_*>::allocator(&local_59);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_40,__l,&local_59);
  Instr::Instr(&this->super_Instr,resultType,&local_40,local_28);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_40);
  std::allocator<flow::Value_*>::~allocator(&local_59);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__CastInstr_002ba4f0;
  return;
}

Assistant:

CastInstr(LiteralType resultType, Value* op, const std::string& name)
      : Instr(resultType, {op}, name) {}